

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.c
# Opt level: O0

void strbuf_init(strbuf_t *s,int len)

{
  char *pcVar1;
  int local_18;
  int size;
  int len_local;
  strbuf_t *s_local;
  
  if (len < 1) {
    local_18 = 0x3ff;
  }
  else {
    local_18 = len + 1;
  }
  s->buf = (char *)0x0;
  s->size = local_18;
  s->length = 0;
  s->increment = -2;
  s->dynamic = 0;
  s->reallocs = 0;
  s->debug = 0;
  pcVar1 = (char *)malloc((long)local_18);
  s->buf = pcVar1;
  if (s->buf == (char *)0x0) {
    die("Out of memory");
  }
  strbuf_ensure_null(s);
  return;
}

Assistant:

void strbuf_init(strbuf_t *s, int len)
{
    int size;

    if (len <= 0)
        size = STRBUF_DEFAULT_SIZE;
    else
        size = len + 1;         /* \0 terminator */

    s->buf = NULL;
    s->size = size;
    s->length = 0;
    s->increment = STRBUF_DEFAULT_INCREMENT;
    s->dynamic = 0;
    s->reallocs = 0;
    s->debug = 0;

    s->buf = (char *)malloc(size);
    if (!s->buf)
        die("Out of memory");

    strbuf_ensure_null(s);
}